

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O0

int from_base_64(int c)

{
  undefined4 local_c;
  int c_local;
  
  if ((c < 0x41) || (0x5a < c)) {
    if ((c < 0x61) || (0x7a < c)) {
      if ((c < 0x30) || (0x39 < c)) {
        if (c == 0x2b) {
          local_c = 0x3e;
        }
        else if (c == 0x2f) {
          local_c = 0x3f;
        }
        else if (c == 0x3d) {
          local_c = 0;
        }
        else {
          local_c = 0x16;
        }
      }
      else {
        local_c = c + 4;
      }
    }
    else {
      local_c = c + -0x47;
    }
  }
  else {
    local_c = c + -0x41;
  }
  return local_c;
}

Assistant:

static int from_base_64(int c)
{
    if ('A' <= c && c <= 'Z')
    {
        return c - 'A';
    }
    else if ('a' <= c && c <= 'z')
    {
        return (c - 'a') + 26;
    }
    else if ('0' <= c && c <= '9')
    {
        return (c - '0') + 52;
    }
    else if ('+' == c)
    {
        return 62;
    }
    else if ('/' == c)
    {
        return 63;
    }
    else if ('=' == c)
    {
        return 0;
    }

    return EINVAL;
}